

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O2

int __thiscall cmCTestBuildAndTestHandler::ProcessHandler(cmCTestBuildAndTestHandler *this)

{
  int iVar1;
  string output;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  (this->Output)._M_string_length = 0;
  *(this->Output)._M_dataplus._M_p = '\0';
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  cmSystemTools::s_FatalErrorOccured = false;
  cmSystemTools::s_ErrorOccured = false;
  iVar1 = RunCMakeAndTest(this,&this->Output);
  cmSystemTools::s_FatalErrorOccured = false;
  cmSystemTools::s_ErrorOccured = false;
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

int cmCTestBuildAndTestHandler::ProcessHandler()
{
  this->Output.clear();
  std::string output;
  cmSystemTools::ResetErrorOccuredFlag();
  int retv = this->RunCMakeAndTest(&this->Output);
  cmSystemTools::ResetErrorOccuredFlag();
  return retv;
}